

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

bool __thiscall
cmFileAPI::AddProjectQuery(cmFileAPI *this,ObjectKind kind,uint majorVersion,uint minorVersion)

{
  bool bVar1;
  __normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
  local_58;
  Object *local_50;
  __normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
  local_48;
  __normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
  local_40;
  undefined1 local_38 [8];
  Object query;
  uint minorVersion_local;
  uint majorVersion_local;
  ObjectKind kind_local;
  cmFileAPI *this_local;
  
  switch(kind) {
  case CodeModel:
    if ((majorVersion != 2) || (7 < minorVersion)) {
      return false;
    }
    break;
  case ConfigureLog:
  case InternalTest:
    return false;
  case Cache:
    if ((majorVersion != 2) || (minorVersion != 0)) {
      return false;
    }
    break;
  case CMakeFiles:
    if ((majorVersion != 1) || (1 < minorVersion)) {
      return false;
    }
    break;
  case Toolchains:
    if ((majorVersion != 1) || (minorVersion != 0)) {
      return false;
    }
  }
  query.Version._4_4_ = minorVersion;
  Object::Object((Object *)local_38);
  query._0_8_ = ZEXT48(majorVersion);
  local_38._0_4_ = kind;
  local_48._M_current =
       (Object *)
       std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::begin
                 (&(this->TopQuery).Known);
  local_50 = (Object *)
             std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::end
                       (&(this->TopQuery).Known);
  local_40 = std::
             find<__gnu_cxx::__normal_iterator<cmFileAPI::Object*,std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>>,cmFileAPI::Object>
                       (local_48,(__normal_iterator<cmFileAPI::Object_*,_std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>_>
                                  )local_50,(Object *)local_38);
  local_58._M_current =
       (Object *)
       std::vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>::end
                 (&(this->TopQuery).Known);
  bVar1 = __gnu_cxx::operator==(&local_40,&local_58);
  if (bVar1) {
    std::vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>>::
    emplace_back<cmFileAPI::Object&>
              ((vector<cmFileAPI::Object,std::allocator<cmFileAPI::Object>> *)&this->TopQuery,
               (Object *)local_38);
    this->QueryExists = true;
  }
  return true;
}

Assistant:

bool cmFileAPI::AddProjectQuery(cmFileAPI::ObjectKind kind,
                                unsigned majorVersion, unsigned minorVersion)
{
  switch (kind) {
    case ObjectKind::CodeModel:
      if (majorVersion != 2 || minorVersion > CodeModelV2Minor) {
        return false;
      }
      break;
    case ObjectKind::Cache:
      if (majorVersion != 2 || minorVersion > CacheV2Minor) {
        return false;
      }
      break;
    case ObjectKind::CMakeFiles:
      if (majorVersion != 1 || minorVersion > CMakeFilesV1Minor) {
        return false;
      }
      break;
    case ObjectKind::Toolchains:
      if (majorVersion != 1 || minorVersion > ToolchainsV1Minor) {
        return false;
      }
      break;
    // These cannot be requested by the project
    case ObjectKind::ConfigureLog:
    case ObjectKind::InternalTest:
      return false;
  }

  Object query;
  query.Kind = kind;
  query.Version = majorVersion;
  if (std::find(this->TopQuery.Known.begin(), this->TopQuery.Known.end(),
                query) == this->TopQuery.Known.end()) {
    this->TopQuery.Known.emplace_back(query);
    this->QueryExists = true;
  }

  return true;
}